

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dns.cpp
# Opt level: O0

bool __thiscall xmrig::Dns::resolve(Dns *this,String *host)

{
  bool bVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  long in_RDI;
  String *in_stack_ffffffffffffffd8;
  Dns *in_stack_ffffffffffffffe0;
  undefined8 uVar5;
  
  bVar1 = String::operator!=((String *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (bVar1) {
    String::operator=((String *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    clear(in_stack_ffffffffffffffe0);
  }
  uVar3 = uv_default_loop();
  uVar5 = *(undefined8 *)(in_RDI + 0x88);
  pcVar4 = String::data((String *)(in_RDI + 0x70));
  uVar2 = uv_getaddrinfo(uVar3,uVar5,onResolved,pcVar4,0,in_RDI);
  *(undefined4 *)(in_RDI + 0x38) = uVar2;
  return *(int *)(in_RDI + 0x38) == 0;
}

Assistant:

bool xmrig::Dns::resolve(const String &host)
{
    if (m_host != host) {
        m_host = host;

        clear();
    }

    m_status = uv_getaddrinfo(uv_default_loop(), m_resolver, Dns::onResolved, m_host.data(), nullptr, &m_hints);

    return m_status == 0;
}